

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t MATROSKA_BlockGetFrame
                (matroska_block *Block,size_t FrameNum,matroska_frame *Frame,bool_t WithData)

{
  long lVar1;
  long lVar2;
  err_t eVar3;
  uint8_t *puVar4;
  mkv_timestamp_t mVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  mkv_timestamp_t mVar9;
  
  if (WithData != 0) {
    if ((Block->Base).Base.bValueIsSet == '\0') {
      __assert_fail("!WithData || Block->Base.Base.bValueIsSet",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x5ff,
                    "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                   );
    }
    if ((Block->Data)._Used == 0) {
      return -0x15;
    }
  }
  eVar3 = -4;
  if (FrameNum < (Block->SizeList)._Used >> 2) {
    if (WithData == 0) {
      puVar4 = (uint8_t *)0x0;
    }
    else {
      puVar4 = (uint8_t *)(Block->Data)._Begin;
    }
    mVar9 = 0x7fffffffffffffff;
    Frame->Data = puVar4;
    mVar5 = MATROSKA_BlockTimestamp(Block);
    Frame->Timestamp = mVar5;
    if (FrameNum == 0) {
      sVar7 = 0;
    }
    else {
      lVar8 = Frame->Timestamp;
      uVar6 = 0;
      do {
        if (WithData != 0) {
          Frame->Data = Frame->Data + *(uint *)((Block->SizeList)._Begin + uVar6 * 4);
        }
        if (lVar8 != 0x7fffffffffffffff) {
          lVar2 = 0x7fffffffffffffff;
          if ((uVar6 < (Block->Durations)._Used >> 3) &&
             (lVar1 = *(long *)((Block->Durations)._Begin + uVar6 * 8), lVar2 = lVar8 + lVar1,
             lVar1 == 0x7fffffffffffffff)) {
            lVar2 = 0x7fffffffffffffff;
          }
          lVar8 = lVar2;
          Frame->Timestamp = lVar8;
        }
        uVar6 = uVar6 + 1;
        sVar7 = FrameNum;
      } while (FrameNum != uVar6);
    }
    Frame->Size = *(uint32_t *)((Block->SizeList)._Begin + sVar7 * 4);
    if (FrameNum < (Block->Durations)._Used >> 3) {
      mVar9 = *(mkv_timestamp_t *)((Block->Durations)._Begin + sVar7 * 8);
    }
    Frame->Duration = mVar9;
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

err_t MATROSKA_BlockGetFrame(const matroska_block *Block, size_t FrameNum, matroska_frame *Frame, bool_t WithData)
{
    size_t i;

    assert(!WithData || Block->Base.Base.bValueIsSet);
    if (WithData && !ARRAYCOUNT(Block->Data,uint8_t))
        return ERR_READ;
    if (FrameNum >= ARRAYCOUNT(Block->SizeList,uint32_t))
        return ERR_INVALID_PARAM;

    Frame->Data = WithData ? ARRAYBEGIN(Block->Data,uint8_t) : NULL;
    Frame->Timestamp = MATROSKA_BlockTimestamp((matroska_block*)Block);
    for (i=0;i<FrameNum;++i)
    {
        if (WithData) Frame->Data += ARRAYBEGIN(Block->SizeList,uint32_t)[i];
        if (Frame->Timestamp != INVALID_TIMESTAMP_T)
        {
            if (i < ARRAYCOUNT(Block->Durations,mkv_timestamp_t) && ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i] != INVALID_TIMESTAMP_T)
                Frame->Timestamp += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            else
                Frame->Timestamp = INVALID_TIMESTAMP_T;
        }
    }

    Frame->Size = ARRAYBEGIN(Block->SizeList,uint32_t)[i];
    if (FrameNum < ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        Frame->Duration = ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
    else
        Frame->Duration = INVALID_TIMESTAMP_T;
    return ERR_NONE;
}